

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::io::anon_unknown_0::IoTest_BlockingFileIoWithTimeout_Test::
~IoTest_BlockingFileIoWithTimeout_Test(IoTest_BlockingFileIoWithTimeout_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(IoTest, BlockingFileIoWithTimeout) {
  int fd[2];

  for (int i = 0; i < kBlockSizeCount; i++) {
    ASSERT_EQ(socketpair(AF_UNIX, SOCK_STREAM, 0, fd), 0);
    struct timeval tv {
      .tv_sec = 0, .tv_usec = 5000
    };
    ASSERT_EQ(setsockopt(fd[0], SOL_SOCKET, SO_RCVTIMEO, &tv, sizeof(tv)), 0);
    FileInputStream input(fd[0], kBlockSizes[i]);
    uint8_t byte;
    EXPECT_EQ(ReadFromInput(&input, &byte, 1), 0);
    EXPECT_EQ(EAGAIN, input.GetErrno());
  }
}